

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O3

int Disconnectubloxx(UBLOX *publox)

{
  int iVar1;
  size_t sVar2;
  long lVar3;
  timespec local_30;
  
  lVar3 = 0;
  while ((UBLOX *)addrsublox[lVar3] != publox) {
    lVar3 = lVar3 + 1;
    if (lVar3 == 0x10) {
      return 1;
    }
  }
  if (publox->bSendStopSentence != 0) {
    sVar2 = strlen(publox->szStopSentence);
    iVar1 = TransferToublox(publox,(uchar *)publox->szStopSentence,(int)sVar2);
    if (iVar1 != 0) {
      puts("Error while disconnecting a ublox.");
      CloseRS232Port(&publox->RS232Port);
      return 1;
    }
    local_30.tv_sec = 0;
    local_30.tv_nsec = 50000000;
    nanosleep(&local_30,(timespec *)0x0);
  }
  iVar1 = CloseRS232Port(&publox->RS232Port);
  if (iVar1 != 0) {
    puts("ublox disconnection failed.");
    return 1;
  }
  puts("ublox disconnected.");
  addrsublox[lVar3] = (void *)0x0;
  return 0;
}

Assistant:

HARDWAREX_API int Disconnectubloxx(UBLOX* publox)
{
	int id = 0, res = EXIT_FAILURE;

	while (addrsublox[id] != publox)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	res = Disconnectublox(publox);
	if (res != EXIT_SUCCESS) return res;

	addrsublox[id] = NULL;

	return EXIT_SUCCESS;
}